

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_line(nk_command_buffer *b,float x0,float y0,float x1,float y1,float line_thickness,
                   nk_color c)

{
  void *pvVar1;
  nk_command_line *cmd;
  float line_thickness_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  nk_command_buffer *b_local;
  nk_color c_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1cb7,
                  "void nk_stroke_line(struct nk_command_buffer *, float, float, float, float, float, struct nk_color)"
                 );
  }
  if (((b != (nk_command_buffer *)0x0) && (0.0 < line_thickness)) &&
     (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20), pvVar1 != (void *)0x0)) {
    *(short *)((long)pvVar1 + 0x10) = (short)(int)line_thickness;
    *(short *)((long)pvVar1 + 0x12) = (short)(int)x0;
    *(short *)((long)pvVar1 + 0x14) = (short)(int)y0;
    *(short *)((long)pvVar1 + 0x16) = (short)(int)x1;
    *(short *)((long)pvVar1 + 0x18) = (short)(int)y1;
    *(nk_color *)((long)pvVar1 + 0x1a) = c;
  }
  return;
}

Assistant:

NK_API void
nk_stroke_line(struct nk_command_buffer *b, float x0, float y0,
    float x1, float y1, float line_thickness, struct nk_color c)
{
    struct nk_command_line *cmd;
    NK_ASSERT(b);
    if (!b || line_thickness <= 0) return;
    cmd = (struct nk_command_line*)
        nk_command_buffer_push(b, NK_COMMAND_LINE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->begin.x = (short)x0;
    cmd->begin.y = (short)y0;
    cmd->end.x = (short)x1;
    cmd->end.y = (short)y1;
    cmd->color = c;
}